

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

Result __thiscall
QFlickGestureRecognizer::recognize
          (QFlickGestureRecognizer *this,QGesture *state,QObject *watched,QEvent *event)

{
  QScroller *pQVar1;
  bool bVar2;
  Type TVar3;
  MouseButton MVar4;
  int iVar5;
  State SVar6;
  State SVar7;
  int iVar8;
  ulong uVar9;
  QFlickGesturePrivate *pQVar10;
  QWidget *pQVar11;
  QGraphicsObject *pQVar12;
  PressDelayHandler *this_00;
  QList<QEventPoint> *pQVar13;
  qsizetype qVar14;
  QScroller **ppQVar15;
  QGraphicsScene *pQVar16;
  QGraphicsView **ppQVar17;
  QEvent *in_RCX;
  socklen_t *__addr_len;
  sockaddr *__addr;
  ResultFlag RVar18;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  qreal qVar19;
  double dVar20;
  QPointF QVar21;
  int pressDelay;
  bool scrollerIsActive;
  QGraphicsObject *go_1;
  QWidget *w_1;
  bool scrollerWasScrolling;
  bool scrollerWasDragging;
  QGraphicsView *gv;
  QList<QGraphicsView_*> *__range7;
  QGraphicsScene *scene;
  QGraphicsObject *go;
  QWidget *w;
  QScroller *as;
  QList<QScroller_*> *__range2;
  Input inputType;
  QTouchEvent *te;
  QGraphicsSceneMouseEvent *gsme;
  QMouseEvent *me;
  QGraphicsObject *receiverGraphicsObject;
  QWidget *receiverWidget;
  QScroller *scroller;
  QFlickGesturePrivate *d;
  QFlickGesture *q;
  const_iterator __end7;
  const_iterator __begin7;
  QList<QGraphicsView_*> views;
  QPolygonF goBoundingRectMappedToScene;
  QRegion scrollerRegion;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QScroller_*> activeScrollers;
  QPointF point;
  MouseButtons mouseButtons;
  KeyboardModifiers keyboardModifiers;
  QPoint globalPos;
  Result result;
  int in_stack_fffffffffffffb38;
  KeyboardModifier in_stack_fffffffffffffb3c;
  enum_type in_stack_fffffffffffffb40;
  enum_type in_stack_fffffffffffffb44;
  QScroller *in_stack_fffffffffffffb48;
  PressDelayHandler *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  PressDelayHandler *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  uint uVar22;
  char cVar24;
  uint uVar23;
  undefined4 in_stack_fffffffffffffb80;
  QWidget *in_stack_fffffffffffffb88;
  QGraphicsView *in_stack_fffffffffffffb90;
  Input input;
  QScroller *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffbc8;
  int local_3d4;
  QPointerEvent *local_3d0;
  QEvent *local_3c8;
  QSinglePointEvent *local_3c0;
  qreal local_328;
  qreal local_320;
  undefined1 local_2f0 [24];
  QRegion local_2d8;
  QGraphicsView **local_2d0;
  const_iterator local_2c8;
  const_iterator local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 local_2a0 [32];
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  QSize local_268;
  QPoint local_258;
  undefined1 local_250 [16];
  QRegion local_240;
  QRegion local_238;
  QScroller **local_230;
  const_iterator local_228;
  const_iterator local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  qreal local_200;
  qreal local_1f8;
  undefined8 local_1f0;
  qreal local_1e8;
  undefined8 local_1e0;
  qreal local_1d8;
  qreal local_1d0;
  qreal local_1c8;
  undefined8 local_1c0;
  qreal local_1b8;
  undefined8 local_1b0;
  qreal local_1a8;
  qreal local_1a0;
  qreal local_198;
  qreal local_190;
  qreal local_188;
  qreal local_180;
  qreal local_178;
  undefined8 local_170;
  qreal local_168;
  qreal local_160;
  qreal local_158;
  qreal local_150;
  qreal local_148;
  qreal local_140;
  qreal local_138;
  qreal local_130;
  qreal local_128;
  qreal local_120;
  qreal local_118;
  QPoint local_110;
  qreal local_108;
  qreal local_100;
  qreal local_f8;
  qreal local_f0;
  QPoint local_e8;
  qreal local_e0;
  qreal local_d8;
  qreal local_d0;
  qreal local_c8;
  QPoint local_c0;
  qreal local_b8;
  qreal local_b0;
  QPointF local_a8;
  undefined8 local_90;
  QPoint local_7c;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_74;
  QPoint local_70;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_68;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_64;
  qreal local_60;
  qreal local_58;
  QPoint local_50;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_48;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_44;
  Int local_40;
  Int local_3c;
  QPoint local_38;
  QFlagsStorage<QGestureRecognizer::ResultFlag> local_2c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = QElapsedTimer::isValid();
  if ((uVar9 & 1) == 0) {
    QElapsedTimer::start();
  }
  pQVar10 = QFlickGesture::d_func((QFlickGesture *)0xa7ce05);
  pQVar1 = pQVar10->receiverScroller;
  if (pQVar1 == (QScroller *)0x0) {
    QFlags<QGestureRecognizer::ResultFlag>::QFlags
              ((QFlags<QGestureRecognizer::ResultFlag> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c);
    goto LAB_00a7e5be;
  }
  ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0xa7ce5a);
  pQVar11 = qobject_cast<QWidget*>
                      ((QObject *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0xa7ce7e);
  pQVar12 = qobject_cast<QGraphicsObject*>((QObject *)0xa7ce86);
  this_00 = PressDelayHandler::instance();
  bVar2 = PressDelayHandler::shouldEventBeIgnored(this_00,in_RCX);
  if (bVar2) {
    QFlags<QGestureRecognizer::ResultFlag>::QFlags
              ((QFlags<QGestureRecognizer::ResultFlag> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c);
    goto LAB_00a7e5be;
  }
  local_3c0 = (QSinglePointEvent *)0x0;
  local_3c8 = (QEvent *)0x0;
  local_3d0 = (QPointerEvent *)0x0;
  local_38 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_3c = 0xaaaaaaaa;
  QFlags<Qt::KeyboardModifier>::QFlags
            ((QFlags<Qt::KeyboardModifier> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),in_stack_fffffffffffffb3c
            );
  local_40 = 0xaaaaaaaa;
  QFlags<Qt::MouseButton>::QFlags
            ((QFlags<Qt::MouseButton> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),in_stack_fffffffffffffb3c
            );
  TVar3 = QEvent::type(in_RCX);
  if (TVar3 - MouseButtonPress < 2) {
LAB_00a7cfb0:
    if (pQVar11 == (QWidget *)0x0) {
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb3c);
      goto LAB_00a7e5be;
    }
    if (*(int *)(in_RDI + 8) != 0) {
      local_44.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QInputEvent::modifiers
                     ((QInputEvent *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_3c = (Int)local_44.super_QFlagsStorage<Qt::KeyboardModifier>.i;
      local_48.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QSinglePointEvent::buttons
                     ((QSinglePointEvent *)
                      CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_40 = (Int)local_48.super_QFlagsStorage<Qt::MouseButton>.i;
      QVar21 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7d045);
      in_XMM1_Qa = QVar21.yp;
      local_60 = QVar21.xp;
      local_58 = in_XMM1_Qa;
      local_50 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
      local_3c0 = (QSinglePointEvent *)in_RCX;
      local_38 = local_50;
    }
  }
  else if (TVar3 == MouseButtonDblClick) {
    SVar6 = QScroller::state((QScroller *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    if (SVar6 != Inactive) {
      local_2c.i = (Int)::operator|(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
      goto LAB_00a7e5be;
    }
  }
  else {
    if (TVar3 == MouseMove) goto LAB_00a7cfb0;
    if (TVar3 == Wheel) {
      if (((pQVar10->macIgnoreWheel & 1U) != 0) ||
         (SVar6 = QScroller::state((QScroller *)
                                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
         SVar6 != Inactive)) {
        local_2c.i = (Int)::operator|(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
        goto LAB_00a7e5be;
      }
    }
    else if (TVar3 - GraphicsSceneMouseMove < 3) {
      if (pQVar12 == (QGraphicsObject *)0x0) {
        QFlags<QGestureRecognizer::ResultFlag>::QFlags
                  ((QFlags<QGestureRecognizer::ResultFlag> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c);
        goto LAB_00a7e5be;
      }
      if (*(int *)(in_RDI + 8) != 0) {
        local_64.super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorage<Qt::KeyboardModifier>)
             QGraphicsSceneMouseEvent::modifiers
                       ((QGraphicsSceneMouseEvent *)
                        CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        local_3c = (Int)local_64.super_QFlagsStorage<Qt::KeyboardModifier>.i;
        local_68.super_QFlagsStorage<Qt::MouseButton>.i =
             (QFlagsStorage<Qt::MouseButton>)
             QGraphicsSceneMouseEvent::buttons
                       ((QGraphicsSceneMouseEvent *)
                        CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        local_40 = (Int)local_68.super_QFlagsStorage<Qt::MouseButton>.i;
        local_70 = QGraphicsSceneMouseEvent::screenPos
                             ((QGraphicsSceneMouseEvent *)
                              CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        local_3c8 = in_RCX;
        local_38 = local_70;
      }
    }
    else if ((TVar3 - TouchBegin < 3) && (*(int *)(in_RDI + 8) == 0)) {
      local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QInputEvent::modifiers
                     ((QInputEvent *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_3c = (Int)local_74.super_QFlagsStorage<Qt::KeyboardModifier>.i;
      QPointerEvent::points((QPointerEvent *)in_RCX);
      bVar2 = QList<QEventPoint>::isEmpty((QList<QEventPoint> *)0xa7d188);
      local_3d0 = (QPointerEvent *)in_RCX;
      if (!bVar2) {
        QPointerEvent::points((QPointerEvent *)in_RCX);
        QList<QEventPoint>::at
                  ((QList<QEventPoint> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        local_90 = QEventPoint::globalPosition();
        local_7c = QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
        local_38 = local_7c;
      }
    }
  }
  if (((local_3c0 == (QSinglePointEvent *)0x0) && (local_3c8 == (QEvent *)0x0)) &&
     (local_3d0 == (QPointerEvent *)0x0)) {
    QFlags<QGestureRecognizer::ResultFlag>::QFlags
              ((QFlags<QGestureRecognizer::ResultFlag> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c);
    goto LAB_00a7e5be;
  }
  local_a8.xp = -NAN;
  local_a8.yp = -NAN;
  QPointF::QPointF(&local_a8);
  local_3d4 = 0;
  TVar3 = QEvent::type(in_RCX);
  if (TVar3 == MouseButtonPress) {
    if ((local_3c0 != (QSinglePointEvent *)0x0) &&
       (MVar4 = QSinglePointEvent::button(local_3c0), MVar4 == *(MouseButton *)(in_RDI + 8))) {
      QSinglePointEvent::buttons
                ((QSinglePointEvent *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      bVar2 = ::operator==((QFlagsStorageHelper<Qt::MouseButton,_4>)
                           SUB84((ulong)in_stack_fffffffffffffb48 >> 0x20,0),
                           in_stack_fffffffffffffb40);
      if (bVar2) {
        QVar21 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7d3ca);
        local_c8 = QVar21.yp;
        local_d0 = QVar21.xp;
        local_c0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        local_a8.xp = local_b8;
        local_a8.yp = local_b0;
        local_3d4 = 1;
        goto LAB_00a7da9e;
      }
    }
    if (local_3c0 != (QSinglePointEvent *)0x0) {
      QScroller::stop((QScroller *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb3c);
      goto LAB_00a7e5be;
    }
  }
  else if (TVar3 == MouseButtonRelease) {
    if ((local_3c0 != (QSinglePointEvent *)0x0) &&
       (MVar4 = QSinglePointEvent::button(local_3c0), MVar4 == *(MouseButton *)(in_RDI + 8))) {
      QVar21 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7d49f);
      local_f0 = QVar21.yp;
      local_f8 = QVar21.xp;
      local_e8 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_a8.xp = local_e0;
      local_a8.yp = local_d8;
      local_3d4 = 3;
    }
  }
  else if (TVar3 == MouseMove) {
    if (local_3c0 != (QSinglePointEvent *)0x0) {
      QSinglePointEvent::buttons
                ((QSinglePointEvent *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      bVar2 = ::operator==((QFlagsStorageHelper<Qt::MouseButton,_4>)
                           SUB84((ulong)in_stack_fffffffffffffb48 >> 0x20,0),
                           in_stack_fffffffffffffb40);
      if (bVar2) {
        QVar21 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7d55a);
        local_118 = QVar21.yp;
        local_120 = QVar21.xp;
        local_110 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        local_a8.xp = local_108;
        local_a8.yp = local_100;
        local_3d4 = 2;
      }
    }
  }
  else if (TVar3 == GraphicsSceneMouseMove) {
    if (local_3c8 != (QEvent *)0x0) {
      QGraphicsSceneMouseEvent::buttons
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      bVar2 = ::operator==((QFlagsStorageHelper<Qt::MouseButton,_4>)
                           SUB84((ulong)in_stack_fffffffffffffb48 >> 0x20,0),
                           in_stack_fffffffffffffb40);
      if (bVar2) {
        QVar21 = QGraphicsSceneMouseEvent::scenePos
                           ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffb48);
        local_148 = QVar21.yp;
        local_150 = QVar21.xp;
        local_3d4 = 2;
        local_a8.xp = local_150;
        local_a8.yp = local_148;
      }
    }
  }
  else if (TVar3 == GraphicsSceneMousePress) {
    if ((local_3c8 != (QEvent *)0x0) &&
       (MVar4 = QGraphicsSceneMouseEvent::button
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
       MVar4 == *(MouseButton *)(in_RDI + 8))) {
      QGraphicsSceneMouseEvent::buttons
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      bVar2 = ::operator==((QFlagsStorageHelper<Qt::MouseButton,_4>)
                           SUB84((ulong)in_stack_fffffffffffffb48 >> 0x20,0),
                           in_stack_fffffffffffffb40);
      if (bVar2) {
        QVar21 = QGraphicsSceneMouseEvent::scenePos
                           ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffb48);
        local_128 = QVar21.yp;
        local_130 = QVar21.xp;
        local_3d4 = 1;
        local_a8.xp = local_130;
        local_a8.yp = local_128;
        goto LAB_00a7da9e;
      }
    }
    if (local_3c8 != (QEvent *)0x0) {
      QScroller::stop((QScroller *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
      QFlags<QGestureRecognizer::ResultFlag>::QFlags
                ((QFlags<QGestureRecognizer::ResultFlag> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb3c);
      goto LAB_00a7e5be;
    }
  }
  else if (TVar3 == GraphicsSceneMouseRelease) {
    if ((local_3c8 != (QEvent *)0x0) &&
       (MVar4 = QGraphicsSceneMouseEvent::button
                          ((QGraphicsSceneMouseEvent *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
       MVar4 == *(MouseButton *)(in_RDI + 8))) {
      QVar21 = QGraphicsSceneMouseEvent::scenePos
                         ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffb48);
      local_138 = QVar21.yp;
      local_140 = QVar21.xp;
      local_3d4 = 3;
      local_a8.xp = local_140;
      local_a8.yp = local_138;
    }
  }
  else {
    if (TVar3 == TouchBegin) {
      local_3d4 = 1;
LAB_00a7d7b0:
      if (local_3d4 == 0) {
        local_3d4 = 3;
      }
    }
    else if (TVar3 != TouchUpdate) {
      if (TVar3 != TouchEnd) goto LAB_00a7da9e;
      goto LAB_00a7d7b0;
    }
    if (local_3d4 == 0) {
      local_3d4 = 2;
    }
    QPointerEvent::pointingDevice();
    iVar5 = QInputDevice::type();
    if (iVar5 == 4) {
      pQVar13 = QPointerEvent::points(local_3d0);
      qVar14 = QList<QEventPoint>::size(pQVar13);
      if (qVar14 != 2) {
        QFlags<QGestureRecognizer::ResultFlag>::QFlags
                  ((QFlags<QGestureRecognizer::ResultFlag> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c);
        goto LAB_00a7e5be;
      }
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_170 = QEventPoint::scenePressPosition();
      local_168 = in_XMM1_Qa;
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_1b0 = QEventPoint::scenePosition();
      local_1a8 = in_XMM1_Qa;
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_1c0 = QEventPoint::scenePressPosition();
      local_1b8 = in_XMM1_Qa;
      QVar21 = ::operator-((QPointF *)in_stack_fffffffffffffb48,
                           (QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      qVar19 = QVar21.yp;
      local_1a0 = QVar21.xp;
      local_198 = qVar19;
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_1e0 = QEventPoint::scenePosition();
      local_1d8 = qVar19;
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_1f0 = QEventPoint::scenePressPosition();
      local_1e8 = qVar19;
      QVar21 = ::operator-((QPointF *)in_stack_fffffffffffffb48,
                           (QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      local_1c8 = QVar21.yp;
      local_1d0 = QVar21.xp;
      QVar21 = ::operator+((QPointF *)in_stack_fffffffffffffb48,
                           (QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      local_188 = QVar21.yp;
      local_190 = QVar21.xp;
      QVar21 = operator/((QPointF *)in_stack_fffffffffffffb48,
                         (qreal)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_178 = QVar21.yp;
      local_180 = QVar21.xp;
      QVar21 = ::operator+((QPointF *)in_stack_fffffffffffffb48,
                           (QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40))
      ;
      local_158 = QVar21.yp;
      local_160 = QVar21.xp;
      local_a8.xp = local_160;
      local_a8.yp = local_158;
    }
    else {
      pQVar13 = QPointerEvent::points(local_3d0);
      qVar14 = QList<QEventPoint>::size(pQVar13);
      if (qVar14 != 1) {
        QFlags<QGestureRecognizer::ResultFlag>::QFlags
                  ((QFlags<QGestureRecognizer::ResultFlag> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c);
        goto LAB_00a7e5be;
      }
      QPointerEvent::points(local_3d0);
      QList<QEventPoint>::at
                ((QList<QEventPoint> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                 ,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_200 = (qreal)QEventPoint::scenePosition();
      local_1f8 = in_XMM1_Qa;
      local_a8.xp = local_200;
      local_a8.yp = in_XMM1_Qa;
    }
  }
LAB_00a7da9e:
  iVar5 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  input = (Input)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  if (local_3d4 == 1) {
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    local_210 = &DAT_aaaaaaaaaaaaaaaa;
    local_208 = &DAT_aaaaaaaaaaaaaaaa;
    QScroller::activeScrollers();
    local_220.i = (QScroller **)&DAT_aaaaaaaaaaaaaaaa;
    local_220 = QList<QScroller_*>::begin
                          ((QList<QScroller_*> *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_228.i = (QScroller **)&DAT_aaaaaaaaaaaaaaaa;
    local_228 = QList<QScroller_*>::end
                          ((QList<QScroller_*> *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    while( true ) {
      local_230 = local_228.i;
      bVar2 = QList<QScroller_*>::const_iterator::operator!=(&local_220,local_228);
      iVar5 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      input = (Input)((ulong)in_stack_fffffffffffffb90 >> 0x20);
      if (!bVar2) break;
      ppQVar15 = QList<QScroller_*>::const_iterator::operator*(&local_220);
      if (*ppQVar15 != pQVar1) {
        local_238.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_238);
        QScroller::target((QScroller *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                         );
        pQVar11 = qobject_cast<QWidget*>
                            ((QObject *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        if (pQVar11 == (QWidget *)0x0) {
          QScroller::target((QScroller *)
                            CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          pQVar12 = qobject_cast<QGraphicsObject*>((QObject *)0xa7dcb1);
          if ((pQVar12 != (QGraphicsObject *)0x0) &&
             (pQVar16 = QGraphicsItem::scene((QGraphicsItem *)0xa7dcd9),
             pQVar16 != (QGraphicsScene *)0x0)) {
            local_280 = &DAT_aaaaaaaaaaaaaaaa;
            local_278 = &DAT_aaaaaaaaaaaaaaaa;
            local_270 = &DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffb98 = (QScroller *)&pQVar12->super_QGraphicsItem;
            (*(pQVar12->super_QGraphicsItem)._vptr_QGraphicsItem[3])
                      (local_2a0,&pQVar12->super_QGraphicsItem);
            QGraphicsItem::mapToScene
                      ((QGraphicsItem *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                       (QRectF *)in_stack_fffffffffffffb60);
            local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
            local_2b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
            QGraphicsScene::views((QGraphicsScene *)in_stack_fffffffffffffb48);
            local_2c0.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
            local_2c0 = QList<QGraphicsView_*>::begin
                                  ((QList<QGraphicsView_*> *)
                                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            local_2c8.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
            local_2c8 = QList<QGraphicsView_*>::end
                                  ((QList<QGraphicsView_*> *)
                                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            while( true ) {
              local_2d0 = local_2c8.i;
              bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_2c0,local_2c8);
              if (!bVar2) break;
              ppQVar17 = QList<QGraphicsView_*>::const_iterator::operator*(&local_2c0);
              in_stack_fffffffffffffb90 = *ppQVar17;
              QGraphicsView::mapFromScene
                        ((QGraphicsView *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         (QPolygonF *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
              ;
              QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                             ,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
              QWidget::mapToGlobal
                        ((QWidget *)in_stack_fffffffffffffb50,(QPoint *)in_stack_fffffffffffffb48);
              QPolygon::translated
                        ((QPolygon *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                         (QPoint *)in_stack_fffffffffffffb50);
              QRegion::QRegion(&local_2d8,(QPolygon *)local_2f0,OddEvenFill);
              QRegion::operator|=(&local_238,(QRegion *)&local_2d8);
              QRegion::~QRegion(&local_2d8);
              QPolygon::~QPolygon((QPolygon *)0xa7df10);
              QPolygon::~QPolygon((QPolygon *)0xa7df1d);
              QList<QGraphicsView_*>::const_iterator::operator++(&local_2c0);
            }
            QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0xa7df3c);
            QPolygonF::~QPolygonF((QPolygonF *)0xa7df49);
          }
        }
        else {
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
          local_258 = QWidget::mapToGlobal
                                ((QWidget *)in_stack_fffffffffffffb50,
                                 (QPoint *)in_stack_fffffffffffffb48);
          local_268 = QWidget::size((QWidget *)
                                    CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          QRect::QRect((QRect *)in_stack_fffffffffffffb60,
                       (QPoint *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                       (QSize *)in_stack_fffffffffffffb50);
          QRegion::QRegion(&local_240,(QRect *)local_250,Rectangle);
          QRegion::operator=((QRegion *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (QRegion *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          QRegion::~QRegion(&local_240);
        }
        uVar9 = QRegion::contains((QPoint *)&local_238);
        bVar2 = (uVar9 & 1) != 0;
        if (bVar2) {
          QFlags<QGestureRecognizer::ResultFlag>::QFlags
                    ((QFlags<QGestureRecognizer::ResultFlag> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb3c);
        }
        QRegion::~QRegion(&local_238);
        iVar5 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        input = (Input)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        if (bVar2) goto LAB_00a7dfcd;
      }
      QList<QScroller_*>::const_iterator::operator++(&local_220);
    }
    bVar2 = false;
LAB_00a7dfcd:
    QList<QScroller_*>::~QList((QList<QScroller_*> *)0xa7dfda);
    if (bVar2) goto LAB_00a7e5be;
  }
  SVar6 = QScroller::state((QScroller *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  SVar7 = QScroller::state((QScroller *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  bVar2 = SVar7 == Scrolling;
  if (local_3d4 != 0) {
    ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0xa7e048);
    pQVar11 = qobject_cast<QWidget*>
                        ((QObject *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (pQVar11 == (QWidget *)0x0) {
      ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0xa7e0ea);
      pQVar12 = qobject_cast<QGraphicsObject*>((QObject *)0xa7e0f2);
      if (pQVar12 != (QGraphicsObject *)0x0) {
        QVar21 = QGraphicsItem::mapFromScene
                           ((QGraphicsItem *)
                            CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                            (QPointF *)in_stack_fffffffffffffb60);
        local_a8.yp = QVar21.yp;
        local_a8.xp = QVar21.xp;
      }
      iVar5 = (int)((ulong)pQVar12 >> 0x20);
    }
    else {
      QPointF::toPoint((QPointF *)in_stack_fffffffffffffb50);
      QWidget::mapFromGlobal
                ((QWidget *)in_stack_fffffffffffffb50,(QPoint *)in_stack_fffffffffffffb48);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      local_a8.xp = local_328;
      local_a8.yp = local_320;
      in_stack_fffffffffffffb88 = pQVar11;
    }
    iVar8 = local_3d4;
    QElapsedTimer::elapsed();
    QScroller::handleInput
              (in_stack_fffffffffffffb98,input,(QPointF *)in_stack_fffffffffffffb88,
               CONCAT44(iVar8,in_stack_fffffffffffffb80));
  }
  local_2c.i = 0xaaaaaaaa;
  QFlags<QGestureRecognizer::ResultFlag>::QFlags((QFlags<QGestureRecognizer::ResultFlag> *)0xa7e1a9)
  ;
  SVar7 = QScroller::state((QScroller *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  uVar22 = CONCAT13(1,(int3)in_stack_fffffffffffffb74);
  if (SVar7 != Dragging) {
    SVar7 = QScroller::state((QScroller *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    uVar22 = CONCAT13(SVar7 == Scrolling,(int3)uVar22);
  }
  cVar24 = (char)(uVar22 >> 0x18);
  uVar23 = uVar22;
  if (((local_3c0 != (QSinglePointEvent *)0x0) || (local_3c8 != (QEvent *)0x0)) && (cVar24 != '\0'))
  {
    QFlags<QGestureRecognizer::ResultFlag>::operator|=
              ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,ConsumeEventHint);
  }
  if ((local_3c0 != (QSinglePointEvent *)0x0) || (local_3c8 != (QEvent *)0x0)) {
    if ((SVar6 == Dragging) || ((bVar2 || ((uVar22 & 0x1000000) == 0)))) {
      if ((bVar2) &&
         ((SVar7 = QScroller::state((QScroller *)
                                    CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
          SVar7 == Dragging ||
          (SVar7 = QScroller::state((QScroller *)
                                    CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
          SVar7 == Inactive)))) {
        PressDelayHandler::instance();
        PressDelayHandler::scrollerWasIntercepted
                  ((PressDelayHandler *)
                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      }
    }
    else {
      PressDelayHandler::instance();
      PressDelayHandler::scrollerBecameActive
                ((PressDelayHandler *)CONCAT44(uVar23,in_stack_fffffffffffffb70),
                 (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)in_RSI >> 0x20,0),
                 (QFlagsStorageHelper<Qt::MouseButton,_4>)SUB84(in_RSI,0));
    }
  }
  if (local_3d4 == 0) {
    QFlags<QGestureRecognizer::ResultFlag>::operator|=
              ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,Ignore);
    goto LAB_00a7e5be;
  }
  TVar3 = QEvent::type(in_RCX);
  __addr_len = (socklen_t *)(ulong)TVar3;
  if (TVar3 == MouseButtonPress) {
LAB_00a7e38b:
    SVar6 = QScroller::state((QScroller *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    if (SVar6 == Pressed) {
      QScroller::scrollerProperties(in_stack_fffffffffffffb48);
      QScrollerProperties::scrollMetric
                ((QScrollerProperties *)
                 CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                 (ScrollMetric)((ulong)in_stack_fffffffffffffb50 >> 0x20));
      dVar20 = (double)::QVariant::toReal((bool *)&local_28);
      iVar8 = (int)(dVar20 * 1000.0);
      ::QVariant::~QVariant(&local_28);
      QScrollerProperties::~QScrollerProperties((QScrollerProperties *)0xa7e40f);
      if (0 < iVar8) {
        QFlags<QGestureRecognizer::ResultFlag>::operator|=
                  ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,ConsumeEventHint);
        PressDelayHandler::instance();
        iVar8 = (int)in_RCX;
        PressDelayHandler::pressed
                  (in_stack_fffffffffffffb50,(QEvent *)in_stack_fffffffffffffb48,iVar5);
        QEvent::accept(in_RCX,iVar8,__addr,__addr_len);
      }
    }
  }
  else {
    if (TVar3 == MouseButtonRelease) {
LAB_00a7e510:
      PressDelayHandler::instance();
      bVar2 = PressDelayHandler::released
                        (in_stack_fffffffffffffb60,
                         (QEvent *)CONCAT17(SVar6 == Dragging || bVar2,in_stack_fffffffffffffb58),
                         SUB81((ulong)in_RCX >> 0x38,0),SUB81((ulong)in_RCX >> 0x30,0));
      if (bVar2) {
        QFlags<QGestureRecognizer::ResultFlag>::operator|=
                  ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,ConsumeEventHint);
      }
LAB_00a7e582:
      RVar18 = CancelGesture;
      if (cVar24 != '\0') {
        RVar18 = FinishGesture;
      }
      QFlags<QGestureRecognizer::ResultFlag>::operator|=
                ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,RVar18);
      goto LAB_00a7e5be;
    }
    if ((TVar3 == MouseMove) || (TVar3 == GraphicsSceneMouseMove)) {
      PressDelayHandler::instance();
      bVar2 = PressDelayHandler::isDelaying((PressDelayHandler *)0xa7e4cd);
      if (bVar2) {
        QFlags<QGestureRecognizer::ResultFlag>::operator|=
                  ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,ConsumeEventHint);
      }
LAB_00a7e4e7:
      RVar18 = Ignore;
      if (cVar24 != '\0') {
        RVar18 = TriggerGesture;
      }
      QFlags<QGestureRecognizer::ResultFlag>::operator|=
                ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,RVar18);
      goto LAB_00a7e5be;
    }
    if (TVar3 == GraphicsSceneMousePress) goto LAB_00a7e38b;
    if (TVar3 == GraphicsSceneMouseRelease) goto LAB_00a7e510;
    if (TVar3 != TouchBegin) {
      if (TVar3 == TouchUpdate) goto LAB_00a7e4e7;
      if (TVar3 != TouchEnd) {
        QFlags<QGestureRecognizer::ResultFlag>::operator|=
                  ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,Ignore);
        goto LAB_00a7e5be;
      }
      goto LAB_00a7e582;
    }
  }
  QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  QGesture::setHotSpot
            ((QGesture *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (QPointF *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  RVar18 = MayBeGesture;
  if ((uVar22 & 0x1000000) != 0) {
    RVar18 = TriggerGesture;
  }
  QFlags<QGestureRecognizer::ResultFlag>::operator|=
            ((QFlags<QGestureRecognizer::ResultFlag> *)&local_2c,RVar18);
LAB_00a7e5be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
           (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)local_2c.i;
  }
  __stack_chk_fail();
}

Assistant:

QGestureRecognizer::Result QFlickGestureRecognizer::recognize(QGesture *state,
                                                              QObject *watched,
                                                              QEvent *event)
{
    Q_UNUSED(watched);

    Q_CONSTINIT static QElapsedTimer monotonicTimer;
    if (!monotonicTimer.isValid())
        monotonicTimer.start();

    QFlickGesture *q = static_cast<QFlickGesture *>(state);
    QFlickGesturePrivate *d = q->d_func();

    QScroller *scroller = d->receiverScroller;
    if (!scroller)
        return Ignore; // nothing to do without a scroller?

    QWidget *receiverWidget = qobject_cast<QWidget *>(d->receiver);
#if QT_CONFIG(graphicsview)
    QGraphicsObject *receiverGraphicsObject = qobject_cast<QGraphicsObject *>(d->receiver);
#endif

    // this is only set for events that we inject into the event loop via sendEvent()
    if (PressDelayHandler::instance()->shouldEventBeIgnored(event)) {
        //qFGDebug() << state << "QFG: ignored event: " << event->type();
        return Ignore;
    }

    const QMouseEvent *me = nullptr;
#if QT_CONFIG(graphicsview)
    const QGraphicsSceneMouseEvent *gsme = nullptr;
#endif
    const QTouchEvent *te = nullptr;
    QPoint globalPos;

    // qFGDebug() << "FlickGesture "<<state<<"watched:"<<watched<<"receiver"<<d->receiver<<"event"<<event->type()<<"button"<<button;

    Qt::KeyboardModifiers keyboardModifiers = Qt::NoModifier;
    Qt::MouseButtons mouseButtons = Qt::NoButton;
    switch (event->type()) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        if (!receiverWidget)
            return Ignore;
        if (button != Qt::NoButton) {
            me = static_cast<const QMouseEvent *>(event);
            keyboardModifiers = me->modifiers();
            mouseButtons = me->buttons();
            globalPos = me->globalPosition().toPoint();
        }
        break;
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        if (!receiverGraphicsObject)
            return Ignore;
        if (button != Qt::NoButton) {
            gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
            keyboardModifiers = gsme->modifiers();
            mouseButtons = gsme->buttons();
            globalPos = gsme->screenPos();
        }
        break;
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchEnd:
    case QEvent::TouchUpdate:
        if (button == Qt::NoButton) {
            te = static_cast<const QTouchEvent *>(event);
            keyboardModifiers = te->modifiers();
            if (!te->points().isEmpty())
                globalPos = te->points().at(0).globalPosition().toPoint();
        }
        break;

    // consume all wheel events if the scroller is active
    case QEvent::Wheel:
        if (d->macIgnoreWheel || (scroller->state() != QScroller::Inactive))
            return Ignore | ConsumeEventHint;
        break;

    // consume all dbl click events if the scroller is active
    case QEvent::MouseButtonDblClick:
        if (scroller->state() != QScroller::Inactive)
            return Ignore | ConsumeEventHint;
        break;

    default:
        break;
    }

    if (!me
#if QT_CONFIG(graphicsview)
        && !gsme
#endif
        && !te) // Neither mouse nor touch
        return Ignore;

    // get the current pointer position in local coordinates.
    QPointF point;
    QScroller::Input inputType = (QScroller::Input) 0;

    switch (event->type()) {
    case QEvent::MouseButtonPress:
        if (me && me->button() == button && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputPress;
        } else if (me) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::MouseButtonRelease:
        if (me && me->button() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::MouseMove:
        if (me && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputMove;
        }
        break;

#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
        if (gsme && gsme->button() == button && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputPress;
        } else if (gsme) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::GraphicsSceneMouseRelease:
        if (gsme && gsme->button() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::GraphicsSceneMouseMove:
        if (gsme && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputMove;
        }
        break;
#endif

    case QEvent::TouchBegin:
        inputType = QScroller::InputPress;
        Q_FALLTHROUGH();
    case QEvent::TouchEnd:
        if (!inputType)
            inputType = QScroller::InputRelease;
        Q_FALLTHROUGH();
    case QEvent::TouchUpdate:
        if (!inputType)
            inputType = QScroller::InputMove;

        if (te->pointingDevice()->type() == QInputDevice::DeviceType::TouchPad) {
            if (te->points().size() != 2)  // 2 fingers on pad
                return Ignore;

            point = te->points().at(0).scenePressPosition() +
                    ((te->points().at(0).scenePosition() - te->points().at(0).scenePressPosition()) +
                     (te->points().at(1).scenePosition() - te->points().at(1).scenePressPosition())) / 2;
        } else { // TouchScreen
            if (te->points().size() != 1) // 1 finger on screen
                return Ignore;

            point = te->points().at(0).scenePosition();
        }
        break;

    default:
        break;
    }

    // Check for an active scroller at globalPos
    if (inputType == QScroller::InputPress) {
        const auto activeScrollers = QScroller::activeScrollers();
        for (QScroller *as : activeScrollers) {
            if (as != scroller) {
                QRegion scrollerRegion;

                if (QWidget *w = qobject_cast<QWidget *>(as->target())) {
                    scrollerRegion = QRect(w->mapToGlobal(QPoint(0, 0)), w->size());
#if QT_CONFIG(graphicsview)
                } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(as->target())) {
                    if (const auto *scene = go->scene()) {
                        const auto goBoundingRectMappedToScene = go->mapToScene(go->boundingRect());
                        const auto views = scene->views();
                        for (QGraphicsView *gv : views) {
                            scrollerRegion |= gv->mapFromScene(goBoundingRectMappedToScene)
                                              .translated(gv->mapToGlobal(QPoint(0, 0)));
                        }
                    }
#endif
                }
                // active scrollers always have priority
                if (scrollerRegion.contains(globalPos))
                    return Ignore;
            }
        }
    }

    bool scrollerWasDragging = (scroller->state() == QScroller::Dragging);
    bool scrollerWasScrolling = (scroller->state() == QScroller::Scrolling);

    if (inputType) {
        if (QWidget *w = qobject_cast<QWidget *>(d->receiver))
            point = w->mapFromGlobal(point.toPoint());
#if QT_CONFIG(graphicsview)
        else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->receiver))
            point = go->mapFromScene(point);
#endif

        // inform the scroller about the new event
        scroller->handleInput(inputType, point, monotonicTimer.elapsed());
    }

    // depending on the scroller state return the gesture state
    Result result;
    bool scrollerIsActive = (scroller->state() == QScroller::Dragging ||
                             scroller->state() == QScroller::Scrolling);

    // Consume all mouse events while dragging or scrolling to avoid nasty
    // side effects with Qt's standard widgets.
    if ((me
#if QT_CONFIG(graphicsview)
         || gsme
#endif
         ) && scrollerIsActive)
        result |= ConsumeEventHint;

    // The only problem with this approach is that we consume the
    // MouseRelease when we start the scrolling with a flick gesture, so we
    // have to fake a MouseRelease "somewhere" to not mess with the internal
    // states of Qt's widgets (a QPushButton would stay in 'pressed' state
    // forever, if it doesn't receive a MouseRelease).
    if (me
#if QT_CONFIG(graphicsview)
        || gsme
#endif
        ) {
        if (!scrollerWasDragging && !scrollerWasScrolling && scrollerIsActive)
            PressDelayHandler::instance()->scrollerBecameActive(keyboardModifiers, mouseButtons);
        else if (scrollerWasScrolling && (scroller->state() == QScroller::Dragging || scroller->state() == QScroller::Inactive))
            PressDelayHandler::instance()->scrollerWasIntercepted();
    }

    if (!inputType) {
        result |= Ignore;
    } else {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMousePress:
#endif
            if (scroller->state() == QScroller::Pressed) {
                int pressDelay = int(1000 * scroller->scrollerProperties().scrollMetric(QScrollerProperties::MousePressEventDelay).toReal());
                if (pressDelay > 0) {
                    result |= ConsumeEventHint;

                    PressDelayHandler::instance()->pressed(event, pressDelay);
                    event->accept();
                }
            }
            Q_FALLTHROUGH();
        case QEvent::TouchBegin:
            q->setHotSpot(globalPos);
            result |= scrollerIsActive ? TriggerGesture : MayBeGesture;
            break;

        case QEvent::MouseMove:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseMove:
#endif
            if (PressDelayHandler::instance()->isDelaying())
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchUpdate:
            result |= scrollerIsActive ? TriggerGesture : Ignore;
            break;

#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseRelease:
#endif
        case QEvent::MouseButtonRelease:
            if (PressDelayHandler::instance()->released(event, scrollerWasDragging || scrollerWasScrolling, scrollerIsActive))
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchEnd:
            result |= scrollerIsActive ? FinishGesture : CancelGesture;
            break;

        default:
            result |= Ignore;
            break;
        }
    }
    return result;
}